

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O3

char * mpoisons_subj(monst *mtmp,attack *mattk)

{
  uchar uVar1;
  char *pcVar2;
  char *pcVar3;
  obj **ppoVar4;
  bool bVar5;
  
  uVar1 = mattk->aatyp;
  if (uVar1 == '\x05') {
    return "contact";
  }
  if (uVar1 != '\x0f') {
    if (uVar1 == 0xfe) {
      if (mtmp == &youmonst) {
        ppoVar4 = &uwep;
      }
      else {
        ppoVar4 = &mtmp->mw;
      }
      if (*ppoVar4 == (obj *)0x0) {
        return "attack";
      }
      bVar5 = ((*ppoVar4)->field_0x4b & 0x80) == 0;
      pcVar3 = "attack";
      pcVar2 = "isn\'t a weapon";
    }
    else {
      bVar5 = uVar1 == '\x02';
      pcVar3 = "bite";
      pcVar2 = "Spell-casting";
    }
    pcVar2 = pcVar2 + 8;
    if (bVar5) {
      pcVar2 = pcVar3;
    }
    return pcVar2;
  }
  return "gaze";
}

Assistant:

const char *mpoisons_subj(struct monst *mtmp, const struct attack *mattk)
{
	if (mattk->aatyp == AT_WEAP) {
	    struct obj *mwep = (mtmp == &youmonst) ? uwep : MON_WEP(mtmp);
	    /* "Foo's attack was poisoned." is pretty lame, but at least
	       it's better than "sting" when not a stinging attack... */
	    return (!mwep || !mwep->opoisoned) ? "attack" : "weapon";
	} else {
	    return (mattk->aatyp == AT_TUCH) ? "contact" :
		   (mattk->aatyp == AT_GAZE) ? "gaze" :
		   (mattk->aatyp == AT_BITE) ? "bite" : "sting";
	}
}